

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_approx.h
# Opt level: O1

Context __thiscall
mp::
FuncConConverter_MIP_CRTP<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>
::Convert(FuncConConverter_MIP_CRTP<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>
          *this,ItemType *con,int param_2)

{
  undefined1 **ppuVar1;
  pointer *ppiVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  _Type var;
  int iVar7;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar8;
  pointer pdVar9;
  pointer conName;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar10;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *pFVar11;
  long *plVar12;
  undefined8 *puVar13;
  size_type *psVar14;
  long *plVar15;
  ulong *puVar16;
  ulong uVar17;
  pointer piVar18;
  undefined8 uVar19;
  NodeRange NVar20;
  NodeRange NVar21;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  warn;
  vector<int,_std::allocator<int>_> local_5a8;
  long lStack_590;
  double local_588;
  ulong *local_580;
  long local_578;
  ulong local_570;
  long lStack_568;
  long *local_560;
  undefined8 local_558;
  long local_550;
  undefined8 uStack_548;
  undefined1 **local_540;
  undefined8 local_538;
  undefined1 *puStack_530;
  undefined8 uStack_528;
  long local_520;
  long *local_518;
  long local_510;
  long local_508;
  long lStack_500;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  vector<double,_std::allocator<double>_> local_498;
  vector<double,_std::allocator<double>_> vStack_480;
  vector<double,_std::allocator<double>_> local_468;
  vector<double,_std::allocator<double>_> vStack_450;
  long *local_438 [2];
  long local_428 [2];
  string local_418;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  local_3f8;
  void *local_358;
  undefined8 uStack_350;
  long local_348;
  void *pvStack_340;
  undefined8 local_338;
  long lStack_330;
  double local_328;
  double dStack_320;
  void *local_318;
  undefined8 uStack_310;
  long local_308;
  void *pvStack_300;
  undefined8 local_2f8;
  long lStack_2f0;
  void *local_2e8;
  undefined8 uStack_2e0;
  long local_2d8;
  void *pvStack_2d0;
  undefined8 local_2c8;
  long lStack_2c0;
  double local_2b8;
  double dStack_2b0;
  void *local_2a8;
  undefined8 uStack_2a0;
  long local_298;
  void *pvStack_290;
  undefined8 local_288;
  long lStack_280;
  string local_278;
  string local_258;
  PLApproxParams local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  LinTerms local_148;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_d0;
  
  var[0] = (con->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId>
           ).args_._M_elems[0];
  local_520 = (long)(con->super_FunctionalConstraint).result_var_;
  local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.fUsePeriod = false;
  local_238.periodicFactorRange.lb = -1e+100;
  local_238.periodicFactorRange.ub = 1e+100;
  local_238.periodRemainderRange.lb = -1e+100;
  local_238.periodRemainderRange.ub = 1e+100;
  pFVar8 = (this->
           super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ).
           super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           .mdl_cvt_;
  local_238.ubErr =
       (pFVar8->
       super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       ).options_.PLApproxRelTol_;
  local_238.grDom.uby =
       (pFVar8->
       super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       ).options_.PLApproxDomain_;
  pdVar9 = (pFVar8->
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ).
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_238.grDom.lby = -local_238.grDom.uby;
  dVar4 = pdVar9[var[0]];
  local_238.grDom.lbx = local_238.grDom.lby;
  if (local_238.grDom.lby <= dVar4) {
    local_238.grDom.lbx = dVar4;
  }
  conName = (pFVar8->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ).
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  local_238.grDom.ubx = local_238.grDom.uby;
  if (conName[var[0]] <= local_238.grDom.uby) {
    local_238.grDom.ubx = conName[var[0]];
  }
  dVar4 = pdVar9[local_520];
  if (local_238.grDom.lby <= dVar4) {
    local_238.grDom.lby = dVar4;
  }
  if (conName[local_520] <= local_238.grDom.uby) {
    local_238.grDom.uby = conName[local_520];
  }
  local_238.is_x_int =
       (pFVar8->
       super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       ).
       super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .super_FlatModel<mp::DefaultFlatModelParams>.var_type_.
       super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
       super__Vector_impl_data._M_start[var[0]] == INTEGER;
  GetWarningKeyAndText_abi_cxx11_(&local_188,(mp *)"Asinh",(char *)conName,local_238.ubErr);
  pFVar10 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_188.first._M_dataplus._M_p,
             local_188.first._M_dataplus._M_p + local_188.first._M_string_length);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_188.second._M_dataplus._M_p,
             local_188.second._M_dataplus._M_p + local_188.second._M_string_length);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddWarning(pFVar10,&local_258,&local_278,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  PLApproximate<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinhId>>
            (con,&local_238);
  pFVar10 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  if (local_238.fUsePeriod != false) {
    NVar20 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddVar(pFVar10,local_238.periodRemainderRange.lb,local_238.periodRemainderRange.ub,
                      CONTINUOUS);
    NVar21 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)(this->
                         super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         ).
                         super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         .mdl_cvt_,local_238.periodicFactorRange.lb,local_238.periodicFactorRange.ub
                      ,INTEGER);
    pFVar11 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
               *)(this->
                 super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).
                 super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .mdl_cvt_;
    std::vector<double,_std::allocator<double>_>::vector(&local_498,&local_238.plPoints.x_);
    std::vector<double,_std::allocator<double>_>::vector(&vStack_480,&local_238.plPoints.y_);
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    paVar3 = &local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
    local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_3f8.super_FunctionalConstraint.result_var_ = -1;
    local_3f8.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
    local_348 = 0;
    local_358 = (void *)0x0;
    uStack_350 = 0;
    lStack_330 = 0;
    pvStack_340 = (void *)0x0;
    local_338 = 0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.X0_ = local_328;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.Y0_ = dStack_320;
    local_2f8 = 0;
    lStack_2f0 = 0;
    local_308 = 0;
    pvStack_300 = (void *)0x0;
    local_318 = (void *)0x0;
    uStack_310 = 0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
    pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar3;
    local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.args_.
    _M_elems[0] = (_Type)(_Type)NVar20.ir_.beg_;
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::
    RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
              (pFVar11,(int)local_520,&local_3f8);
    if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
        params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f8.
                      super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                      params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
        params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f8.
                      super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                      params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
        params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f8.
                      super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                      params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.pls_.slopes_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.pls_.slopes_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
        params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f8.
                      super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                      params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.pls_.breakpoints_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f8.
                            super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                            .params_.pls_.breakpoints_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
        paVar3) {
      operator_delete(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                      _M_p,CONCAT71(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_allocated_capacity._1_7_,
                                    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_local_buf[0]) + 1);
    }
    if (pvStack_300 != (void *)0x0) {
      operator_delete(pvStack_300,lStack_2f0 - (long)pvStack_300);
    }
    if (local_318 != (void *)0x0) {
      operator_delete(local_318,local_308 - (long)local_318);
    }
    if (pvStack_340 != (void *)0x0) {
      operator_delete(pvStack_340,lStack_330 - (long)pvStack_340);
    }
    if (local_358 != (void *)0x0) {
      operator_delete(local_358,local_348 - (long)local_358);
    }
    if (vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pFVar10 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this->
                 super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).
                 super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .mdl_cvt_;
    iVar7 = (con->super_FunctionalConstraint).result_var_;
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::PropagateResultOfInitExpr
              (pFVar10,iVar7,
               (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar7],
               (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar7],(Context)(con->super_FunctionalConstraint).ctx.value_);
    pFVar10 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this->
                 super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).
                 super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .mdl_cvt_;
    local_540 = (undefined1 **)local_238.periodLength;
    local_538 = 0x3ff0000000000000;
    puStack_530 = &DAT_bff0000000000000;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_540;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_3f8,__l,
               (allocator_type *)&local_580);
    local_560 = (long *)CONCAT44(NVar20.ir_.beg_,NVar21.ir_.beg_);
    local_558 = CONCAT44(local_558._4_4_,var[0]);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&local_560;
    std::vector<int,_std::allocator<int>_>::vector(&local_5a8,__l_00,(allocator_type *)&local_518);
    LinTerms::LinTerms(&local_148,(vector<double,_std::allocator<double>_> *)&local_3f8,&local_5a8);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              (&local_d0,&local_148,(AlgConRhs<0>)0x0,true);
    NVar20 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)pFVar10,&local_d0);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(pFVar10,NVar20);
    if (6 < local_d0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_d0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
                      .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_d0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
                      .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_d0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_d0.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_d0.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.super_BasicConstraint.name_._M_dataplus._M_p !=
        &local_d0.super_BasicConstraint.name_.field_2) {
      operator_delete(local_d0.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_d0.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((pointer *)
        local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                      _M_p,CONCAT71(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_allocated_capacity._1_7_,
                                    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_local_buf[0]) -
                           (long)local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.
                                 _M_dataplus._M_p);
    }
    goto LAB_0026702c;
  }
  dVar4 = (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[var[0]];
  local_588 = (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[var[0]];
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds(pFVar10,var[0],local_238.grDomOut.lbx,local_238.grDomOut.ubx);
  pFVar10 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  dVar5 = (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[var[0]];
  dVar6 = (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[var[0]];
  if ((dVar4 < dVar5) || (dVar6 < local_588)) {
    paVar3 = &local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
    local_588 = dVar6;
    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"PLApproxDomain_","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3f8);
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    psVar14 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4f8.field_2._M_allocated_capacity = *psVar14;
      local_4f8.field_2._8_4_ = (undefined4)plVar12[3];
      local_4f8.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
    }
    else {
      local_4f8.field_2._M_allocated_capacity = *psVar14;
      local_4f8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_4f8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"Argument domain of a \'","");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_438);
    local_518 = &local_508;
    plVar15 = plVar12 + 2;
    if ((long *)*plVar12 == plVar15) {
      local_508 = *plVar15;
      lStack_500 = plVar12[3];
    }
    else {
      local_508 = *plVar15;
      local_518 = (long *)*plVar12;
    }
    local_510 = plVar12[1];
    *plVar12 = (long)plVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_518);
    puVar16 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar16) {
      local_570 = *puVar16;
      lStack_568 = plVar12[3];
      local_580 = &local_570;
    }
    else {
      local_570 = *puVar16;
      local_580 = (ulong *)*plVar12;
    }
    local_578 = plVar12[1];
    *plVar12 = (long)puVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_4b8,vsnprintf,0x148,"%f",SUB84(dVar5,0));
    uVar17 = 0xf;
    if (local_580 != &local_570) {
      uVar17 = local_570;
    }
    if (uVar17 < local_4b8._M_string_length + local_578) {
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        uVar19 = local_4b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_4b8._M_string_length + local_578) goto LAB_002669d8;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_4b8,0,(char *)0x0,(ulong)local_580);
    }
    else {
LAB_002669d8:
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_580,(ulong)local_4b8._M_dataplus._M_p);
    }
    local_560 = &local_550;
    plVar12 = puVar13 + 2;
    if ((long *)*puVar13 == plVar12) {
      local_550 = *plVar12;
      uStack_548 = puVar13[3];
    }
    else {
      local_550 = *plVar12;
      local_560 = (long *)*puVar13;
    }
    local_558 = puVar13[1];
    *puVar13 = plVar12;
    puVar13[1] = 0;
    *(undefined1 *)plVar12 = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_560);
    ppiVar2 = &local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    puVar16 = (ulong *)(plVar12 + 2);
    if ((pointer *)*plVar12 == (pointer *)puVar16) {
      local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*puVar16;
      lStack_590 = plVar12[3];
      local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppiVar2;
    }
    else {
      local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*puVar16;
      local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar12;
    }
    local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar12[1];
    *plVar12 = (long)puVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_4d8,vsnprintf,0x148,"%f",SUB84(local_588,0));
    piVar18 = (pointer)0xf;
    if ((pointer *)
        local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar2) {
      piVar18 = local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if (piVar18 < (pointer)(local_4d8._M_string_length +
                           (long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish)) {
      uVar19 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        uVar19 = local_4d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 <
          (pointer)(local_4d8._M_string_length +
                   (long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish)) goto LAB_00266b13;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_4d8,0,(char *)0x0,
                           (ulong)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    }
    else {
LAB_00266b13:
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_5a8,(ulong)local_4d8._M_dataplus._M_p);
    }
    local_540 = &puStack_530;
    ppuVar1 = (undefined1 **)(puVar13 + 2);
    if ((undefined1 **)*puVar13 == ppuVar1) {
      puStack_530 = *ppuVar1;
      uStack_528 = puVar13[3];
    }
    else {
      puStack_530 = *ppuVar1;
      local_540 = (undefined1 **)*puVar13;
    }
    local_538 = puVar13[1];
    *puVar13 = ppuVar1;
    puVar13[1] = 0;
    *(undefined1 *)ppuVar1 = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_540);
    psVar14 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_418.field_2._M_allocated_capacity = *psVar14;
      local_418.field_2._8_8_ = plVar12[3];
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    }
    else {
      local_418.field_2._M_allocated_capacity = *psVar14;
      local_418._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_418._M_string_length = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning(pFVar10,&local_4f8,&local_418,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if (local_540 != &puStack_530) {
      operator_delete(local_540,(ulong)(puStack_530 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar2) {
      operator_delete(local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_560 != &local_550) {
      operator_delete(local_560,local_550 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    if (local_518 != &local_508) {
      operator_delete(local_518,local_508 + 1);
    }
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
        paVar3) {
      operator_delete(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                      _M_p,CONCAT71(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_allocated_capacity._1_7_,
                                    local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_local_buf[0]) + 1);
    }
  }
  pFVar11 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  std::vector<double,_std::allocator<double>_>::vector(&local_468,&local_238.plPoints.x_);
  std::vector<double,_std::allocator<double>_>::vector(&vStack_450,&local_238.plPoints.y_);
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_
  .y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_
  .y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_
  .y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_
  .x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_
  .x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_
  .x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  paVar3 = &local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_3f8.super_FunctionalConstraint.result_var_ = -1;
  local_3f8.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_2d8 = 0;
  local_2e8 = (void *)0x0;
  uStack_2e0 = 0;
  lStack_2c0 = 0;
  pvStack_2d0 = (void *)0x0;
  local_2c8 = 0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .X0_ = local_2b8;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .Y0_ = dStack_2b0;
  local_288 = 0;
  lStack_280 = 0;
  local_298 = 0;
  pvStack_290 = (void *)0x0;
  local_2a8 = (void *)0x0;
  uStack_2a0 = 0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_
  .slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)paVar3;
  local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.args_.
  _M_elems[0] = (_Type)(_Type)var[0];
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
            (pFVar11,(int)local_520,&local_3f8);
  if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.breakpoints_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.breakpoints_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar3
     ) {
    operator_delete(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                    _M_p,CONCAT71(local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.
                                  field_2._M_allocated_capacity._1_7_,
                                  local_3f8.super_FunctionalConstraint.super_BasicConstraint.name_.
                                  field_2._M_local_buf[0]) + 1);
  }
  if (pvStack_290 != (void *)0x0) {
    operator_delete(pvStack_290,lStack_280 - (long)pvStack_290);
  }
  if (local_2a8 != (void *)0x0) {
    operator_delete(local_2a8,local_298 - (long)local_2a8);
  }
  if (pvStack_2d0 != (void *)0x0) {
    operator_delete(pvStack_2d0,lStack_2c0 - (long)pvStack_2d0);
  }
  if (local_2e8 != (void *)0x0) {
    operator_delete(local_2e8,local_2d8 - (long)local_2e8);
  }
  if (vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pFVar10 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  iVar7 = (con->super_FunctionalConstraint).result_var_;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            (pFVar10,iVar7,
             (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar7],
             (pFVar10->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar7],(Context)(con->super_FunctionalConstraint).ctx.value_);
LAB_0026702c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.second._M_dataplus._M_p != &local_188.second.field_2) {
    operator_delete(local_188.second._M_dataplus._M_p,
                    local_188.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.first._M_dataplus._M_p != &local_188.first.field_2) {
    operator_delete(local_188.first._M_dataplus._M_p,
                    local_188.first.field_2._M_allocated_capacity + 1);
  }
  if (local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.plPoints.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.plPoints.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Context)CTX_MIX;
}

Assistant:

Context Convert(const ItemType& con, int ) {
    assert(!con.GetContext().IsNone());
    assert(1==con.GetArguments().size());          // 1 argument var
    auto x = con.GetArguments()[0];
    auto y = con.GetResultVar();
    PLApproxParams laPrm;
    laPrm.ubErr = GetMC().PLApproxRelTol();
    auto dm = GetMC().PLApproxDomain();
    /// Narrow graph domain to +-dm
    laPrm.grDom.lbx = std::max(GetMC().lb(x), -dm);
    laPrm.grDom.ubx = std::min(GetMC().ub(x), dm);
    laPrm.grDom.lby = std::max(GetMC().lb(y), -dm);
    laPrm.grDom.uby = std::min(GetMC().ub(y), dm);
    laPrm.is_x_int = GetMC().is_var_integer(x);

    auto warn = GetWarningKeyAndText(con.GetTypeName(), laPrm.ubErr);
    GetMC().AddWarning( warn.first, warn.second );

    PLApproximate(con, laPrm);
    if (!laPrm.fUsePeriod) {
      auto lbx = GetMC().lb(x);
      auto ubx = GetMC().ub(x);
      GetMC().NarrowVarBounds(x,
                              laPrm.grDomOut.lbx, laPrm.grDomOut.ubx);
      auto lbx1 = GetMC().lb(x);
      auto ubx1 = GetMC().ub(x);
      if (lbx1 > lbx || ubx1 < ubx) {
        GetMC().AddWarning(
            std::string("PLApproxDomain_") + con.GetTypeName(),
            std::string("Argument domain of a '")
                + con.GetTypeName()
                + "'\n"
                  "has been reduced to ["
                + std::to_string(lbx1) + ", "
                + std::to_string(ubx1)
                + "] for numerical reasons\n"
                  "(partially controlled by cvt:plapprox:domain.)");
      }
      GetMC().RedefineVariable(y,
                               PLConstraint({x}, laPrm.plPoints));
      GetMC().PropagateResultOfInitExpr(
            // propagate ctx into new constr
            con.GetResultVar(), con.GetContext());
    } else {
      auto rmd = GetMC().AddVar(
            laPrm.periodRemainderRange.lb,
            laPrm.periodRemainderRange.ub);
      auto factor = GetMC().AddVar(
            laPrm.periodicFactorRange.lb,
            laPrm.periodicFactorRange.ub,
            var::INTEGER);
      GetMC().RedefineVariable(y,
                               PLConstraint({int(rmd)}, laPrm.plPoints));
      GetMC().PropagateResultOfInitExpr(
            // propagate ctx into new constr
            con.GetResultVar(), con.GetContext());
      GetMC().AddConstraint( LinConEQ{  // x = period * factor + rmd
                               { {laPrm.periodLength, 1.0, -1.0},
                                 {int(factor), int(rmd), x} },
                               {0.0} } );
    }
    return Context::CTX_MIX;
  }